

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_curves.cpp
# Opt level: O3

void __thiscall
agg::curve3_div::bezier
          (curve3_div *this,double x1,double y1,double x2,double y2,double x3,double y3)

{
  pod_bvector<agg::point_base<double>,_6U> *this_00;
  long lVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  this_00 = (pod_bvector<agg::point_base<double>,_6U> *)(this + 0x20);
  uVar2 = *(uint *)(this + 0x20);
  uVar4 = uVar2 >> 6;
  if (*(uint *)(this + 0x24) <= uVar4) {
    pod_bvector<agg::point_base<double>,_6U>::allocate_block(this_00,uVar4);
    uVar2 = this_00->m_size;
  }
  lVar1 = *(long *)(*(long *)(this + 0x30) + (ulong)uVar4 * 8);
  uVar3 = (ulong)((uVar2 & 0x3f) << 4);
  *(double *)(lVar1 + uVar3) = x1;
  *(double *)(lVar1 + 8 + uVar3) = y1;
  *(uint *)(this + 0x20) = uVar2 + 1;
  recursive_bezier(this,x1,y1,x2,y2,x3,y3,0);
  uVar2 = *(uint *)(this + 0x20);
  uVar4 = uVar2 >> 6;
  if (*(uint *)(this + 0x24) <= uVar4) {
    pod_bvector<agg::point_base<double>,_6U>::allocate_block(this_00,uVar4);
    uVar2 = this_00->m_size;
  }
  lVar1 = *(long *)(*(long *)(this + 0x30) + (ulong)uVar4 * 8);
  uVar3 = (ulong)((uVar2 & 0x3f) << 4);
  *(double *)(lVar1 + uVar3) = x3;
  *(double *)(lVar1 + 8 + uVar3) = y3;
  *(uint *)(this + 0x20) = uVar2 + 1;
  return;
}

Assistant:

void curve3_div::bezier(double x1, double y1, 
                            double x2, double y2, 
                            double x3, double y3)
    {
        m_points.add(point_d(x1, y1));
        recursive_bezier(x1, y1, x2, y2, x3, y3, 0);
        m_points.add(point_d(x3, y3));
    }